

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_create_secret.hpp
# Opt level: O2

void __thiscall
duckdb::LogicalCreateSecret::LogicalCreateSecret
          (LogicalCreateSecret *this,CreateSecretInput *secret_input_p)

{
  LogicalOperator::LogicalOperator(&this->super_LogicalOperator,LOGICAL_CREATE_SECRET);
  (this->super_LogicalOperator)._vptr_LogicalOperator =
       (_func_int **)&PTR__LogicalCreateSecret_027bae50;
  CreateSecretInput::CreateSecretInput(&this->secret_input,secret_input_p);
  return;
}

Assistant:

explicit LogicalCreateSecret(CreateSecretInput secret_input_p)
	    : LogicalOperator(LogicalOperatorType::LOGICAL_CREATE_SECRET), secret_input(std::move(secret_input_p)) {
	}